

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O1

char * cmTargetPropertyComputer::GetLocation<cmTarget>
                 (cmTarget *tgt,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  ulong __n;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t len;
  string configName;
  string local_50;
  
  if ((tgt->TargetTypeValue < OBJECT_LIBRARY) || (tgt->TargetTypeValue == UNKNOWN_LIBRARY)) {
    if ((GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
         ::propLOCATION_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                                     ::propLOCATION_abi_cxx11_), iVar3 != 0)) {
      GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
      ::propLOCATION_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                     ::propLOCATION_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                  ::propLOCATION_abi_cxx11_,"LOCATION","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                    ::propLOCATION_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                           ::propLOCATION_abi_cxx11_);
    }
    __n = prop->_M_string_length;
    if ((__n == GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                ::propLOCATION_abi_cxx11_._M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp((prop->_M_dataplus)._M_p,
                      GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                      ::propLOCATION_abi_cxx11_._M_dataplus._M_p,__n), iVar3 == 0)))) {
      if ((tgt->IsImportedTarget != false) ||
         (bVar2 = HandleLocationPropertyPolicy(&tgt->Name,messenger,context), bVar2)) {
        pcVar5 = ComputeLocationForBuild<cmTarget>(tgt);
        return pcVar5;
      }
    }
    else {
      pcVar5 = (prop->_M_dataplus)._M_p;
      iVar3 = strncmp(pcVar5,"LOCATION_",9);
      if (iVar3 == 0) {
        if ((tgt->IsImportedTarget != false) ||
           (bVar2 = HandleLocationPropertyPolicy(&tgt->Name,messenger,context), bVar2)) {
          pcVar1 = (prop->_M_dataplus)._M_p;
          pcVar5 = pcVar1 + 9;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar4 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar5,pcVar1 + sVar4 + 9);
          pcVar5 = ComputeLocation<cmTarget>(tgt,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            return pcVar5;
          }
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          return pcVar5;
        }
      }
      else if (8 < __n) {
        iVar3 = strcmp(pcVar5 + (__n - 9),"_LOCATION");
        if ((iVar3 == 0) && (iVar3 = strncmp(pcVar5,"XCODE_ATTRIBUTE_",0x10), iVar3 != 0)) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar5,pcVar5 + (__n - 9));
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar3 != 0) {
            if ((tgt->IsImportedTarget != false) ||
               (bVar2 = HandleLocationPropertyPolicy(&tgt->Name,messenger,context), bVar2)) {
              tgt = (cmTarget *)ComputeLocation<cmTarget>(tgt,&local_50);
            }
            else {
              tgt = (cmTarget *)0x0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (iVar3 != 0) {
            return (char *)tgt;
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char* GetLocation(Target const* tgt, std::string const& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return CM_NULLPTR;
        }
        return ComputeLocationForBuild(tgt);
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return CM_NULLPTR;
        }
        const char* configName = prop.c_str() + 9;
        return ComputeLocation(tgt, configName);
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                            context)) {
            return CM_NULLPTR;
          }
          return ComputeLocation(tgt, configName);
        }
      }
    }
    return CM_NULLPTR;
  }